

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  item[0].valuedouble = 0.0;
  item[0].string = (char *)0x0;
  item[0].valuestring = (char *)0x0;
  item[0].valueint = 0;
  item[0]._44_4_ = 0;
  item[0].child = (cJSON *)0x0;
  item[0].type = 0;
  item[0]._28_4_ = 0;
  item[0].next = (cJSON *)0x0;
  item[0].prev = (cJSON *)0x0;
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/FSMaxB[P]cJSON/tests/parse_array.c"
            );
  UnityDefaultTestRun(parse_array_should_parse_empty_arrays,"parse_array_should_parse_empty_arrays",
                      0xa1);
  UnityDefaultTestRun(parse_array_should_parse_arrays_with_one_element,
                      "parse_array_should_parse_arrays_with_one_element",0xa2);
  UnityDefaultTestRun(parse_array_should_parse_arrays_with_multiple_elements,
                      "parse_array_should_parse_arrays_with_multiple_elements",0xa3);
  UnityDefaultTestRun(parse_array_should_not_parse_non_arrays,
                      "parse_array_should_not_parse_non_arrays",0xa4);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    memset(item, 0, sizeof(cJSON));

    UNITY_BEGIN();
    RUN_TEST(parse_array_should_parse_empty_arrays);
    RUN_TEST(parse_array_should_parse_arrays_with_one_element);
    RUN_TEST(parse_array_should_parse_arrays_with_multiple_elements);
    RUN_TEST(parse_array_should_not_parse_non_arrays);
    return UNITY_END();
}